

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

double __thiscall S2Cell::ApproxArea(S2Cell *this)

{
  double *pdVar1;
  FloatType FVar2;
  double dVar3;
  double dVar4;
  double local_d8;
  double local_d0;
  S2Point local_c8;
  S2Point local_b0;
  D local_98;
  S2Point local_80;
  S2Point local_68;
  D local_50;
  Vector3<double> local_38;
  double local_20;
  double flat_area;
  S2Cell *this_local;
  
  flat_area = (double)this;
  if (this->level_ < '\x02') {
    this_local = (S2Cell *)AverageArea((int)this->level_);
  }
  else {
    GetVertex(&local_68,this,2);
    GetVertex(&local_80,this,0);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_50,(BasicVector<Vector3,_double,_3UL> *)&local_68,&local_80);
    GetVertex(&local_b0,this,3);
    GetVertex(&local_c8,this,1);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_98,(BasicVector<Vector3,_double,_3UL> *)&local_b0,&local_c8);
    Vector3<double>::CrossProd(&local_38,&local_50,&local_98);
    FVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                      ((BasicVector<Vector3,_double,_3UL> *)&local_38);
    local_20 = FVar2 * 0.5;
    dVar3 = local_20 * 2.0;
    local_d0 = local_20 * 0.3183098861837907;
    local_d8 = 1.0;
    pdVar1 = std::min<double>(&local_d0,&local_d8);
    dVar4 = sqrt(1.0 - *pdVar1);
    this_local = (S2Cell *)(dVar3 / (dVar4 + 1.0));
  }
  return (double)this_local;
}

Assistant:

double S2Cell::ApproxArea() const {
  // All cells at the first two levels have the same area.
  if (level_ < 2) return AverageArea(level_);

  // First, compute the approximate area of the cell when projected
  // perpendicular to its normal.  The cross product of its diagonals gives
  // the normal, and the length of the normal is twice the projected area.
  double flat_area = 0.5 * (GetVertex(2) - GetVertex(0)).
                     CrossProd(GetVertex(3) - GetVertex(1)).Norm();

  // Now, compensate for the curvature of the cell surface by pretending
  // that the cell is shaped like a spherical cap.  The ratio of the
  // area of a spherical cap to the area of its projected disc turns out
  // to be 2 / (1 + sqrt(1 - r*r)) where "r" is the radius of the disc.
  // For example, when r=0 the ratio is 1, and when r=1 the ratio is 2.
  // Here we set Pi*r*r == flat_area to find the equivalent disc.
  return flat_area * 2 / (1 + sqrt(1 - min(M_1_PI * flat_area, 1.0)));
}